

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::requantize_from_int32_to_int8
               (Mat *src,Mat *dst,Mat *scale_in_data,Mat *scale_out_data,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  int *piVar1;
  Layer *pLVar2;
  void **ppvVar3;
  void **in_RCX;
  void **in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  void **in_R8;
  int in_R9D;
  undefined8 in_stack_00000010;
  Mat weights [3];
  ParamDict pd;
  Layer *requantize;
  ParamDict *in_stack_fffffffffffffd00;
  Mat *in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd14;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  ParamDict *in_stack_fffffffffffffd20;
  void **ppvVar4;
  void **local_2c8;
  void **local_268;
  undefined1 local_258 [16];
  void *local_248;
  int *local_240;
  void *local_238;
  undefined4 local_230;
  long *local_228;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  void *local_208;
  void *local_200;
  int *local_1f8;
  void *local_1f0;
  undefined4 local_1e8;
  long *local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  void *local_1c0;
  void *local_1b8;
  int *local_1b0;
  void *local_1a8;
  undefined4 local_1a0;
  long *local_198;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  void *local_178;
  void *apvStack_170 [3];
  ParamDict local_158;
  Layer *local_148;
  int local_13c;
  void **local_138;
  void **local_130;
  void **local_128;
  undefined8 local_120;
  undefined8 local_118;
  void **local_110;
  void **local_100;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  void **local_e0;
  void **local_d8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  void **local_c0;
  void **local_b8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  void **local_a0;
  void **local_98;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  int local_80;
  undefined4 local_7c;
  void **local_78;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  int local_50;
  undefined4 local_4c;
  void **local_48;
  void *local_28;
  
  local_13c = in_R9D;
  local_138 = in_R8;
  local_130 = in_RCX;
  local_128 = in_RDX;
  local_120 = in_RSI;
  local_118 = in_RDI;
  local_148 = create_layer(in_stack_fffffffffffffd1c);
  ParamDict::ParamDict(in_stack_fffffffffffffd20);
  ParamDict::set(&local_158,0,*(int *)((long)local_128 + 0x2c));
  ParamDict::set(&local_158,1,*(int *)((long)local_130 + 0x2c));
  ParamDict::set(&local_158,2,*(int *)((long)local_138 + 0x2c));
  ParamDict::set(&local_158,3,local_13c);
  ParamDict::set((ParamDict *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 in_stack_fffffffffffffd14,in_stack_fffffffffffffd08);
  (*local_148->_vptr_Layer[2])(local_148,&local_158);
  local_268 = &local_248;
  do {
    local_110 = local_268;
    *local_268 = (void *)0x0;
    local_268[1] = (void *)0x0;
    local_268[2] = (void *)0x0;
    *(undefined4 *)(local_268 + 3) = 0;
    local_268[4] = (void *)0x0;
    *(undefined4 *)(local_268 + 5) = 0;
    *(undefined4 *)((long)local_268 + 0x2c) = 0;
    *(undefined4 *)(local_268 + 6) = 0;
    *(undefined4 *)((long)local_268 + 0x34) = 0;
    *(undefined4 *)(local_268 + 7) = 0;
    local_268[8] = (void *)0x0;
    local_268 = local_268 + 9;
  } while (local_268 != apvStack_170);
  local_a8 = local_128;
  local_a0 = &local_248;
  if (&local_248 != local_128) {
    if (local_128[1] != (void *)0x0) {
      piVar1 = (int *)local_128[1];
      local_ac = 1;
      LOCK();
      local_b0 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_88 = &local_248;
    if (local_240 != (int *)0x0) {
      local_8c = 0xffffffff;
      LOCK();
      local_90 = *local_240;
      *local_240 = *local_240 + -1;
      UNLOCK();
      if (local_90 == 1) {
        if (local_228 == (long *)0x0) {
          if (local_248 != (void *)0x0) {
            free(local_248);
          }
        }
        else {
          (**(code **)(*local_228 + 0x18))(local_228,local_248);
        }
      }
    }
    local_248 = *local_a8;
    local_240 = (int *)local_a8[1];
    local_238 = local_a8[2];
    local_230 = *(undefined4 *)(local_a8 + 3);
    local_228 = (long *)local_a8[4];
    local_220 = *(undefined4 *)(local_a8 + 5);
    local_21c = *(undefined4 *)((long)local_a8 + 0x2c);
    local_218 = *(undefined4 *)(local_a8 + 6);
    local_214 = *(undefined4 *)((long)local_a8 + 0x34);
    local_210 = *(undefined4 *)(local_a8 + 7);
    local_208 = local_a8[8];
  }
  local_c8 = local_130;
  local_c0 = &local_200;
  local_98 = &local_248;
  if (&local_200 != local_130) {
    if (local_130[1] != (void *)0x0) {
      piVar1 = (int *)local_130[1];
      local_cc = 1;
      LOCK();
      local_d0 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_78 = &local_200;
    if (local_1f8 != (int *)0x0) {
      local_7c = 0xffffffff;
      LOCK();
      local_80 = *local_1f8;
      *local_1f8 = *local_1f8 + -1;
      UNLOCK();
      if (local_80 == 1) {
        if (local_1e0 == (long *)0x0) {
          if (local_200 != (void *)0x0) {
            free(local_200);
          }
        }
        else {
          (**(code **)(*local_1e0 + 0x18))(local_1e0,local_200);
        }
      }
    }
    local_200 = *local_c8;
    local_1f8 = (int *)local_c8[1];
    local_1f0 = local_c8[2];
    local_1e8 = *(undefined4 *)(local_c8 + 3);
    local_1e0 = (long *)local_c8[4];
    local_1d8 = *(undefined4 *)(local_c8 + 5);
    local_1d4 = *(undefined4 *)((long)local_c8 + 0x2c);
    local_1d0 = *(undefined4 *)(local_c8 + 6);
    local_1cc = *(undefined4 *)((long)local_c8 + 0x34);
    local_1c8 = *(undefined4 *)(local_c8 + 7);
    local_1c0 = local_c8[8];
  }
  local_e8 = local_138;
  local_e0 = &local_1b8;
  local_b8 = &local_200;
  if (&local_1b8 != local_138) {
    if (local_138[1] != (void *)0x0) {
      piVar1 = (int *)local_138[1];
      local_ec = 1;
      LOCK();
      local_f0 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_68 = &local_1b8;
    if (local_1b0 != (int *)0x0) {
      local_6c = 0xffffffff;
      LOCK();
      local_70 = *local_1b0;
      *local_1b0 = *local_1b0 + -1;
      UNLOCK();
      if (local_70 == 1) {
        if (local_198 == (long *)0x0) {
          if (local_1b8 != (void *)0x0) {
            free(local_1b8);
          }
        }
        else {
          (**(code **)(*local_198 + 0x18))(local_198,local_1b8);
        }
      }
    }
    local_1b8 = *local_e8;
    local_1b0 = (int *)local_e8[1];
    local_1a8 = local_e8[2];
    local_1a0 = *(undefined4 *)(local_e8 + 3);
    local_198 = (long *)local_e8[4];
    local_190 = *(undefined4 *)(local_e8 + 5);
    local_18c = *(undefined4 *)((long)local_e8 + 0x2c);
    local_188 = *(undefined4 *)(local_e8 + 6);
    local_184 = *(undefined4 *)((long)local_e8 + 0x34);
    local_180 = *(undefined4 *)(local_e8 + 7);
    local_178 = local_e8[8];
  }
  pLVar2 = local_148;
  local_d8 = &local_1b8;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffffd20,
             (Mat *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  (*pLVar2->_vptr_Layer[3])(pLVar2,local_258);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffd00);
  (*local_148->_vptr_Layer[4])(local_148,in_stack_00000010);
  (*local_148->_vptr_Layer[7])(local_148,local_118,local_120,in_stack_00000010);
  (*local_148->_vptr_Layer[5])(local_148,in_stack_00000010);
  if (local_148 != (Layer *)0x0) {
    (*local_148->_vptr_Layer[1])();
  }
  local_2c8 = apvStack_170;
  do {
    ppvVar3 = local_2c8 + -9;
    ppvVar4 = ppvVar3;
    local_100 = ppvVar3;
    local_48 = ppvVar3;
    if (local_2c8[-8] != (void *)0x0) {
      piVar1 = (int *)local_2c8[-8];
      local_4c = 0xffffffff;
      LOCK();
      local_50 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_50 == 1) {
        if (local_2c8[-5] == (void *)0x0) {
          local_28 = *ppvVar3;
          if (local_28 != (void *)0x0) {
            free(local_28);
          }
        }
        else {
          (**(code **)(*local_2c8[-5] + 0x18))(local_2c8[-5],*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    local_2c8[-7] = (void *)0x0;
    *(undefined4 *)(local_2c8 + -6) = 0;
    *(undefined4 *)(local_2c8 + -4) = 0;
    *(undefined4 *)((long)local_2c8 + -0x1c) = 0;
    *(undefined4 *)(local_2c8 + -3) = 0;
    *(undefined4 *)((long)local_2c8 + -0x14) = 0;
    *(undefined4 *)(local_2c8 + -2) = 0;
    local_2c8[-1] = (void *)0x0;
    local_2c8[-8] = (void *)0x0;
    local_2c8 = ppvVar4;
  } while (ppvVar4 != &local_248);
  ParamDict::~ParamDict(in_stack_fffffffffffffd00);
  return;
}

Assistant:

void requantize_from_int32_to_int8(const Mat& src, Mat& dst, const Mat& scale_in_data, const Mat& scale_out_data, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in_data.w);
    pd.set(1, scale_out_data.w);
    pd.set(2, bias_data.w);
    pd.set(3, activation_type);
    pd.set(4, activation_params);

    requantize->load_param(pd);

    Mat weights[3];
    weights[0] = scale_in_data;
    weights[1] = scale_out_data;
    weights[2] = bias_data;

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}